

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O0

TextureId __thiscall
CS248::GLResourceManager::createTextureFromData
          (GLResourceManager *this,uchar *data,int width,int height)

{
  TextureId TVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> tex_bind;
  TextureId texid;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *in_stack_ffffffffffffffb0;
  GLResourceManager *in_stack_ffffffffffffffc0;
  TextureId in_stack_ffffffffffffffcc;
  
  TVar1 = createTexture((GLResourceManager *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bindTexture(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffcc);
  glTexImage2D(0xde1,0,0x1907,in_EDX,in_ECX,0,0x1908,0x1401,in_RSI);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr
            (in_stack_ffffffffffffffb0);
  return (TextureId)TVar1.id;
}

Assistant:

TextureId GLResourceManager::createTextureFromData(const unsigned char* data, int width, int height) {
  TextureId texid = createTexture();
  auto tex_bind = bindTexture(texid);
  glTexImage2D(GL_TEXTURE_2D, /*level=*/0, GL_RGB, width, height, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, (void *)data);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);  
  //glGenerateMipmap(GL_TEXTURE_2D);
  return texid;
}